

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::parseProcessorLatencyDeclaration(StructuralParser *this)

{
  ModuleBase *pMVar1;
  ProcessorProperty *pPVar2;
  Expression *pEVar3;
  long lVar4;
  CompileMessage CStack_c8;
  CompileMessage local_90;
  CompileMessage local_58;
  
  pPVar2 = parseProcessorProperty(this);
  if (*(int *)&(pPVar2->super_Expression).field_0x2c != 5) {
    CompileMessageHelpers::createMessage<>
              (&local_58,syntax,error,"Expected a function or variable declaration");
    AST::Context::throwError
              (&(pPVar2->super_Expression).super_Statement.super_ASTObject.context,&local_58,false);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d51);
  lVar4 = 0;
  pEVar3 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2881d4);
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    lVar4 = __dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::Processor::typeinfo,0);
  }
  if (lVar4 != 0) {
    if (*(long *)(lVar4 + 0x130) == 0) {
      *(Expression **)(lVar4 + 0x130) = pEVar3;
      return;
    }
    CompileMessageHelpers::createMessage<>
              (&local_90,syntax,error,"The processor.latency value must not be set more than once");
    AST::Context::throwError
              (&(pPVar2->super_Expression).super_Statement.super_ASTObject.context,&local_90,false);
  }
  CompileMessageHelpers::createMessage<>
            (&CStack_c8,syntax,error,
             "The processor.latency value can only be declared in a processor");
  AST::Context::throwError
            (&(pPVar2->super_Expression).super_Statement.super_ASTObject.context,&CStack_c8,false);
}

Assistant:

void parseProcessorLatencyDeclaration()
    {
        auto& pp = parseProcessorProperty();

        if (pp.property != heart::ProcessorProperty::Property::latency)
            pp.context.throwError (Errors::expectedFunctionOrVariable());

        expect (Operator::assign);
        auto& value = parseExpression();
        expect (Operator::semicolon);

        if (auto p = cast<AST::Processor> (module))
        {
            if (p->latency != nullptr)
                pp.context.throwError (Errors::latencyAlreadyDeclared());

            p->latency = value;
            return;
        }

        pp.context.throwError (Errors::latencyOnlyForProcessor());
    }